

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbor_parser.hpp
# Opt level: O3

void __thiscall
jsoncons::cbor::
basic_cbor_parser<jsoncons::binary_iterator_source<(anonymous_namespace)::MyIterator>,_std::allocator<char>_>
::begin_array(basic_cbor_parser<jsoncons::binary_iterator_source<(anonymous_namespace)::MyIterator>,_std::allocator<char>_>
              *this,item_event_visitor *visitor,uint8_t info,error_code *ec)

{
  size_t *psVar1;
  int iVar2;
  uint8_t *puVar3;
  bool bVar4;
  bool pop_stringref_map_stack;
  size_t len;
  bool local_35;
  parse_mode local_34;
  uint64_t local_30;
  
  iVar2 = this->nesting_depth_;
  this->nesting_depth_ = iVar2 + 1;
  if (iVar2 < *(int *)((this->options_)._vptr_cbor_decode_options[-3] + 8 +
                      (long)&(this->options_)._vptr_cbor_decode_options)) {
    local_35 = false;
    bVar4 = ((this->other_tags_).super__Base_bitset<1UL>._M_w & 2) != 0;
    if (bVar4) {
      std::
      vector<std::vector<jsoncons::cbor::basic_cbor_parser<jsoncons::binary_iterator_source<(anonymous_namespace)::MyIterator>,_std::allocator<char>_>::mapped_string,_std::allocator<jsoncons::cbor::basic_cbor_parser<jsoncons::binary_iterator_source<(anonymous_namespace)::MyIterator>,_std::allocator<char>_>::mapped_string>_>,_std::allocator<std::vector<jsoncons::cbor::basic_cbor_parser<jsoncons::binary_iterator_source<(anonymous_namespace)::MyIterator>,_std::allocator<char>_>::mapped_string,_std::allocator<jsoncons::cbor::basic_cbor_parser<jsoncons::binary_iterator_source<(anonymous_namespace)::MyIterator>,_std::allocator<char>_>::mapped_string>_>_>_>
      ::emplace_back<>(&this->stringref_map_stack_);
      *(byte *)&(this->other_tags_).super__Base_bitset<1UL>._M_w =
           (byte)(this->other_tags_).super__Base_bitset<1UL>._M_w & 0xfd;
    }
    local_35 = bVar4;
    if (info == '\x1f') {
      local_30 = CONCAT44(local_30._4_4_,3);
      local_34 = root;
      std::vector<jsoncons::cbor::parse_state,std::allocator<jsoncons::cbor::parse_state>>::
      emplace_back<jsoncons::cbor::parse_mode,int,bool&>
                ((vector<jsoncons::cbor::parse_state,std::allocator<jsoncons::cbor::parse_state>> *)
                 &this->state_stack_,(parse_mode *)&local_30,(int *)&local_34,&local_35);
      (*visitor->_vptr_basic_item_event_visitor[6])(visitor,0,this,ec);
      this->more_ = (bool)(this->cursor_mode_ ^ 1);
      puVar3 = (this->source_).current_.p_;
      if (puVar3 != (this->source_).end_.p_) {
        psVar1 = &(this->source_).position_;
        *psVar1 = *psVar1 + 1;
        (this->source_).current_.p_ = puVar3 + 1;
      }
    }
    else {
      local_30 = get_uint64_value(this,ec);
      if (ec->_M_value == 0) {
        local_34 = array;
        std::vector<jsoncons::cbor::parse_state,std::allocator<jsoncons::cbor::parse_state>>::
        emplace_back<jsoncons::cbor::parse_mode,unsigned_long&,bool&>
                  ((vector<jsoncons::cbor::parse_state,std::allocator<jsoncons::cbor::parse_state>>
                    *)&this->state_stack_,&local_34,&local_30,&local_35);
        (*visitor->_vptr_basic_item_event_visitor[7])(visitor,local_30,0,this,ec);
        this->more_ = (bool)(this->cursor_mode_ ^ 1);
      }
    }
  }
  else {
    std::error_code::operator=(ec,max_nesting_depth_exceeded);
    this->more_ = false;
  }
  return;
}

Assistant:

void begin_array(item_event_visitor& visitor, uint8_t info, std::error_code& ec)
    {
        if (JSONCONS_UNLIKELY(++nesting_depth_ > options_.max_nesting_depth()))
        {
            ec = cbor_errc::max_nesting_depth_exceeded;
            more_ = false;
            return;
        } 
        semantic_tag tag = semantic_tag::none;
        bool pop_stringref_map_stack = false;
        if (other_tags_[stringref_namespace_tag])
        {
            stringref_map_stack_.emplace_back();
            other_tags_[stringref_namespace_tag] = false;
            pop_stringref_map_stack = true;
        }
        switch (info)
        {
            case jsoncons::cbor::detail::additional_info::indefinite_length:
            {
                state_stack_.emplace_back(parse_mode::indefinite_array,0,pop_stringref_map_stack);
                visitor.begin_array(tag, *this, ec);
                more_ = !cursor_mode_;
                source_.ignore(1);
                break;
            }
            default: // definite length
            {
                std::size_t len = get_size(ec);
                if (JSONCONS_UNLIKELY(ec))
                {
                    return;
                }
                state_stack_.emplace_back(parse_mode::array,len,pop_stringref_map_stack);
                visitor.begin_array(len, tag, *this, ec);
                more_ = !cursor_mode_;
                break;
            }
        }
    }